

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

Hash Fossilize::Hashing::compute_hash_application_info(VkApplicationInfo *info)

{
  Hasher local_18;
  
  local_18.h = (((ulong)info->applicationVersion ^ 0xaf63bd4c8601b7df) * 0x100000001b3 ^
               (ulong)info->apiVersion) * 0x100000001b3 ^ (ulong)info->engineVersion;
  if (info->pApplicationName == (char *)0x0) {
    local_18.h = local_18.h * 0x100000001b3;
  }
  else {
    Hasher::string(&local_18,info->pApplicationName);
  }
  if (info->pEngineName == (char *)0x0) {
    local_18.h = local_18.h * 0x100000001b3;
  }
  else {
    Hasher::string(&local_18,info->pEngineName);
  }
  return local_18.h;
}

Assistant:

static Hash compute_hash_application_info(const VkApplicationInfo &info)
{
	Hasher h;
	h.u32(info.applicationVersion);
	h.u32(info.apiVersion);
	h.u32(info.engineVersion);

	if (info.pApplicationName)
		h.string(info.pApplicationName);
	else
		h.u32(0);

	if (info.pEngineName)
		h.string(info.pEngineName);
	else
		h.u32(0);

	return h.get();
}